

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_len_9to16_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  xxh_u64 xVar2;
  xxh_u64 rhs;
  xxh_u64 xVar3;
  XXH64_hash_t XVar4;
  long in_RCX;
  xxh_u64 in_RSI;
  xxh_u64 acc;
  xxh_u64 input_hi;
  xxh_u64 input_lo;
  xxh_u64 bitflip2;
  xxh_u64 bitflip1;
  
  xVar1 = XXH_readLE64((void *)0x10a669);
  xVar2 = XXH_readLE64((void *)0x10a67c);
  rhs = XXH_readLE64((void *)0x10a69f);
  XXH_readLE64((void *)0x10a6b2);
  xVar3 = XXH_readLE64((void *)0x10a6d1);
  XXH_readLE64((void *)0x10a6ee);
  XXH_swap64(xVar3 ^ (xVar1 ^ xVar2) + in_RCX);
  XXH3_mul128_fold64(in_RSI,rhs);
  XVar4 = XXH3_avalanche(0x10a74a);
  return XVar4;
}

Assistant:

XXH_FORCE_INLINE XXH_PUREF XXH64_hash_t
XXH3_len_9to16_64b(const xxh_u8* input, size_t len, const xxh_u8* secret, XXH64_hash_t seed)
{
    XXH_ASSERT(input != NULL);
    XXH_ASSERT(secret != NULL);
    XXH_ASSERT(9 <= len && len <= 16);
    {   xxh_u64 const bitflip1 = (XXH_readLE64(secret+24) ^ XXH_readLE64(secret+32)) + seed;
        xxh_u64 const bitflip2 = (XXH_readLE64(secret+40) ^ XXH_readLE64(secret+48)) - seed;
        xxh_u64 const input_lo = XXH_readLE64(input)           ^ bitflip1;
        xxh_u64 const input_hi = XXH_readLE64(input + len - 8) ^ bitflip2;
        xxh_u64 const acc = len
                          + XXH_swap64(input_lo) + input_hi
                          + XXH3_mul128_fold64(input_lo, input_hi);
        return XXH3_avalanche(acc);
    }
}